

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytree.c
# Opt level: O0

void * tommy_tree_insert(tommy_tree *tree,tommy_tree_node *node,void *data)

{
  tommy_tree_node *ptVar1;
  long in_FS_OFFSET;
  void *data_local;
  tommy_tree_node *node_local;
  tommy_tree *tree_local;
  tommy_tree_node *insert;
  
  insert = *(tommy_tree_node **)(in_FS_OFFSET + 0x28);
  node->data = data;
  node->prev = (tommy_node_struct *)0x0;
  node->next = (tommy_node_struct *)0x0;
  node->key = 0;
  tree_local = (tommy_tree *)node;
  ptVar1 = tommy_tree_insert_node(tree->cmp,tree->root,(tommy_tree_node **)&tree_local);
  tree->root = ptVar1;
  if ((tommy_tree_node *)tree_local == node) {
    tree->count = tree->count + 1;
  }
  if (*(tommy_tree_node **)(in_FS_OFFSET + 0x28) == insert) {
    return tree_local->cmp;
  }
  __stack_chk_fail();
}

Assistant:

void* tommy_tree_insert(tommy_tree* tree, tommy_tree_node* node, void* data)
{
	tommy_tree_node* insert = node;

	insert->data = data;
	insert->prev = 0;
	insert->next = 0;
	insert->key = 0;

	tree->root = tommy_tree_insert_node(tree->cmp, tree->root, &insert);

	if (insert == node)
		++tree->count;

	return insert->data;
}